

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O1

VkRenderPass
synthesize_render_pass
          (StateRecorder *recorder,spvc_compiler frag,uint32_t view_count,uint8_t *active_rt_mask)

{
  VkFormat *pVVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  spvc_bool sVar4;
  byte bVar5;
  bool bVar6;
  spvc_result sVar7;
  uint uVar8;
  SpvId SVar9;
  spvc_basetype sVar10;
  spvc_type psVar11;
  long lVar12;
  uint32_t uVar13;
  VkFormat VVar14;
  VkImageLayout VVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t count;
  spvc_reflected_resource *list;
  spvc_resources resources;
  VkFormat input_rt_formats [8];
  VkFormat rt_formats [8];
  uint input_location_to_attachment [8];
  uint output_location_to_attachment [8];
  VkSubpassDescription2 subpass;
  VkAttachmentDescription2 attachments [8];
  VkAttachmentReference2 input_references [8];
  VkAttachmentReference2 references [8];
  ulong local_558;
  spvc_reflected_resource *local_550;
  uint32_t local_544;
  byte *local_540;
  spvc_resources local_538;
  StateRecorder *local_530;
  VkFormat local_528 [16];
  VkRenderPassCreateInfo2 local_4e8;
  uint local_498 [8];
  uint32_t local_478 [8];
  VkSubpassDescription2 local_458;
  VkAttachmentDescription2 local_3f8 [8];
  VkAttachmentReference2 local_238 [8];
  VkAttachmentReference2 local_138 [8];
  
  local_540 = active_rt_mask;
  sVar7 = spvc_compiler_create_shader_resources(frag,&local_538);
  if (sVar7 == SPVC_SUCCESS) {
    local_528[0xc] = VK_FORMAT_UNDEFINED;
    local_528[0xd] = VK_FORMAT_UNDEFINED;
    local_528[0xe] = VK_FORMAT_UNDEFINED;
    local_528[0xf] = VK_FORMAT_UNDEFINED;
    local_528[8] = VK_FORMAT_UNDEFINED;
    local_528[9] = VK_FORMAT_UNDEFINED;
    local_528[10] = VK_FORMAT_UNDEFINED;
    local_528[0xb] = VK_FORMAT_UNDEFINED;
    local_528[4] = VK_FORMAT_UNDEFINED;
    local_528[5] = VK_FORMAT_UNDEFINED;
    local_528[6] = VK_FORMAT_UNDEFINED;
    local_528[7] = VK_FORMAT_UNDEFINED;
    local_528[0] = VK_FORMAT_UNDEFINED;
    local_528[1] = VK_FORMAT_UNDEFINED;
    local_528[2] = VK_FORMAT_UNDEFINED;
    local_528[3] = VK_FORMAT_UNDEFINED;
    sVar7 = spvc_resources_get_resource_list_for_type
                      (local_538,SPVC_RESOURCE_TYPE_STAGE_OUTPUT,&local_550,&local_558);
    if (sVar7 == SPVC_SUCCESS) {
      local_544 = view_count;
      local_530 = recorder;
      if (local_558 != 0) {
        uVar19 = 0;
        do {
          psVar11 = spvc_compiler_get_type_handle(frag,local_550[uVar19].type_id);
          uVar8 = spvc_type_get_num_array_dimensions(psVar11);
          uVar16 = 1;
          if (uVar8 == 1) {
            sVar4 = spvc_type_array_dimension_is_literal(psVar11,0);
            if (sVar4 == '\0') {
              return (VkRenderPass)0x0;
            }
            SVar9 = spvc_type_get_array_dimension(psVar11,0);
            uVar16 = (ulong)SVar9;
          }
          uVar8 = spvc_compiler_get_decoration(frag,local_550[uVar19].id,SpvDecorationLocation);
          uVar17 = uVar8 + (int)uVar16;
          if (uVar17 < 8) {
            sVar10 = spvc_type_get_basetype(psVar11);
            VVar14 = VK_FORMAT_UNDEFINED;
            if (sVar10 - SPVC_BASETYPE_INT16 < 9) {
              VVar14 = *(VkFormat *)(&DAT_002e7690 + (ulong)(sVar10 - SPVC_BASETYPE_INT16) * 4);
            }
            if ((int)uVar16 != 0) {
              bVar5 = *local_540;
              do {
                local_528[(ulong)uVar8 + 8] = VVar14;
                bVar5 = bVar5 | (byte)(1 << ((byte)uVar8 & 0x1f));
                uVar8 = uVar8 + 1;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              *local_540 = bVar5;
            }
          }
          else {
            synthesize_render_pass();
          }
          if (7 < uVar17) {
            return (VkRenderPass)0x0;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_558);
      }
      sVar7 = spvc_resources_get_resource_list_for_type
                        (local_538,SPVC_RESOURCE_TYPE_SUBPASS_INPUT,&local_550,&local_558);
      if (sVar7 == SPVC_SUCCESS) {
        if (local_558 != 0) {
          uVar19 = 0;
          do {
            psVar11 = spvc_compiler_get_type_handle(frag,local_550[uVar19].type_id);
            uVar8 = spvc_type_get_num_array_dimensions(psVar11);
            uVar16 = 1;
            if (uVar8 == 1) {
              sVar4 = spvc_type_array_dimension_is_literal(psVar11,0);
              if (sVar4 == '\0') {
                return (VkRenderPass)0x0;
              }
              SVar9 = spvc_type_get_array_dimension(psVar11,0);
              uVar16 = (ulong)SVar9;
            }
            uVar8 = spvc_compiler_get_decoration
                              (frag,local_550[uVar19].id,SpvDecorationInputAttachmentIndex);
            uVar17 = uVar8 + (int)uVar16;
            if (uVar17 < 8) {
              sVar10 = spvc_type_get_basetype(psVar11);
              VVar14 = VK_FORMAT_UNDEFINED;
              if (sVar10 - SPVC_BASETYPE_INT16 < 9) {
                VVar14 = *(VkFormat *)(&DAT_002e7690 + (ulong)(sVar10 - SPVC_BASETYPE_INT16) * 4);
              }
              if ((int)uVar16 != 0) {
                do {
                  local_528[uVar8] = VVar14;
                  uVar8 = uVar8 + 1;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
            }
            else {
              synthesize_render_pass();
            }
            if (7 < uVar17) {
              return (VkRenderPass)0x0;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < local_558);
        }
        uVar13 = local_544;
        uVar19 = 0;
        uVar16 = 0;
        do {
          lVar12 = uVar19 + 8;
          uVar19 = uVar19 + 1;
          if (local_528[lVar12] != VK_FORMAT_UNDEFINED) {
            uVar16 = uVar19 & 0xffffffff;
          }
        } while (uVar19 != 8);
        uVar19 = 0;
        uVar18 = 0;
        do {
          pVVar1 = local_528 + uVar19;
          uVar19 = uVar19 + 1;
          if (*pVVar1 != VK_FORMAT_UNDEFINED) {
            uVar18 = uVar19 & 0xffffffff;
          }
        } while (uVar19 != 8);
        uVar2 = (uint32_t)uVar16;
        uVar3 = (uint32_t)uVar18;
        if (uVar2 + uVar3 < 9) {
          local_478[4] = 0;
          local_478[5] = 0;
          local_478[6] = 0;
          local_478[7] = 0;
          local_478[0] = 0;
          local_478[1] = 0;
          local_478[2] = 0;
          local_478[3] = 0;
          local_498[4] = 0;
          local_498[5] = 0;
          local_498[6] = 0;
          local_498[7] = 0;
          local_498[0] = 0;
          local_498[1] = 0;
          local_498[2] = 0;
          local_498[3] = 0;
          local_4e8.pNext = (void *)0x0;
          local_4e8.correlatedViewMaskCount = 0;
          local_4e8._68_4_ = 0;
          local_4e8.pCorrelatedViewMasks = (uint32_t *)0x0;
          local_4e8.dependencyCount = 0;
          local_4e8._52_4_ = 0;
          local_4e8.pDependencies = (VkSubpassDependency2 *)0x0;
          local_4e8.subpassCount = 0;
          local_4e8._36_4_ = 0;
          local_4e8.pSubpasses = (VkSubpassDescription2 *)0x0;
          local_4e8.flags = 0;
          local_4e8.attachmentCount = 0;
          local_4e8.pAttachments = (VkAttachmentDescription2 *)0x0;
          local_4e8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;
          local_4e8._4_4_ = 0;
          memset(local_3f8,0,0x1c0);
          if (uVar2 != 0) {
            uVar19 = 0;
            do {
              VVar14 = local_528[uVar19 + 8];
              if (VVar14 != VK_FORMAT_UNDEFINED) {
                local_3f8[local_4e8.attachmentCount].sType =
                     VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
                local_3f8[local_4e8.attachmentCount].format = VVar14;
                local_3f8[local_4e8.attachmentCount].samples = VK_SAMPLE_COUNT_1_BIT;
                local_3f8[local_4e8.attachmentCount].loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
                local_3f8[local_4e8.attachmentCount].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
                local_3f8[local_4e8.attachmentCount].initialLayout =
                     VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                local_3f8[local_4e8.attachmentCount].finalLayout =
                     VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                local_498[uVar19 + 8] = local_4e8.attachmentCount;
                local_4e8.attachmentCount = local_4e8.attachmentCount + 1;
              }
              uVar19 = uVar19 + 1;
            } while (uVar16 != uVar19);
          }
          if (uVar3 != 0) {
            uVar19 = 0;
            do {
              VVar14 = local_528[uVar19];
              if (VVar14 != VK_FORMAT_UNDEFINED) {
                local_3f8[local_4e8.attachmentCount].sType =
                     VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
                local_3f8[local_4e8.attachmentCount].format = VVar14;
                local_3f8[local_4e8.attachmentCount].samples = VK_SAMPLE_COUNT_1_BIT;
                local_3f8[local_4e8.attachmentCount].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
                local_3f8[local_4e8.attachmentCount].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
                local_3f8[local_4e8.attachmentCount].initialLayout =
                     VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
                local_3f8[local_4e8.attachmentCount].finalLayout =
                     VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
                local_498[uVar19] = local_4e8.attachmentCount;
                local_4e8.attachmentCount = local_4e8.attachmentCount + 1;
              }
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
          local_458.pNext = (void *)0x0;
          local_458.pDepthStencilAttachment = (VkAttachmentReference2 *)0x0;
          local_458.preserveAttachmentCount = 0;
          local_458._76_4_ = 0;
          local_458.pColorAttachments = (VkAttachmentReference2 *)0x0;
          local_458.pResolveAttachments = (VkAttachmentReference2 *)0x0;
          local_458.pInputAttachments = (VkAttachmentReference2 *)0x0;
          local_458.colorAttachmentCount = 0;
          local_458._44_4_ = 0;
          local_458.pPreserveAttachments = (uint32_t *)0x0;
          local_458.sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
          local_458._4_4_ = 0;
          local_458.flags = 0;
          local_458.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
          local_458.inputAttachmentCount = 0;
          local_458.viewMask = ~(-1 << ((byte)uVar13 & 0x1f));
          memset(local_138,0,0x100);
          memset(local_238,0,0x100);
          if (uVar2 != 0) {
            lVar12 = 0;
            do {
              (&local_138[0].sType)[lVar12 * 2] = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
              if (*(int *)((long)local_528 + lVar12 + 0x20) == 0) {
                uVar13 = 0xffffffff;
                VVar15 = VK_IMAGE_LAYOUT_UNDEFINED;
              }
              else {
                uVar13 = *(uint32_t *)((long)local_498 + lVar12 + 0x20);
                VVar15 = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
              }
              (&local_138[0].attachment)[lVar12 * 2] = uVar13;
              (&local_138[0].layout)[lVar12 * 2] = VVar15;
              lVar12 = lVar12 + 4;
            } while (uVar16 << 2 != lVar12);
          }
          if (uVar3 != 0) {
            lVar12 = 0;
            do {
              (&local_238[0].sType)[lVar12 * 2] = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
              if (*(int *)((long)local_528 + lVar12) == 0) {
                uVar13 = 0xffffffff;
                VVar15 = VK_IMAGE_LAYOUT_UNDEFINED;
              }
              else {
                uVar13 = *(uint32_t *)((long)local_498 + lVar12);
                VVar15 = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
              }
              (&local_238[0].attachment)[lVar12 * 2] = uVar13;
              (&local_238[0].layout)[lVar12 * 2] = VVar15;
              lVar12 = lVar12 + 4;
            } while (uVar18 << 2 != lVar12);
          }
          local_4e8.pSubpasses = &local_458;
          local_458.colorAttachmentCount = uVar2;
          local_458.inputAttachmentCount = uVar3;
          local_4e8.subpassCount = 1;
          local_4e8.pAttachments = local_3f8;
          local_458.pInputAttachments = local_238;
          local_458.pColorAttachments = local_138;
          bVar6 = Fossilize::StateRecorder::record_render_pass2
                            (local_530,(VkRenderPass)&DAT_00000001,&local_4e8,0);
          return (VkRenderPass)(ulong)bVar6;
        }
        synthesize_render_pass();
      }
    }
  }
  else {
    synthesize_render_pass();
  }
  return (VkRenderPass)0x0;
}

Assistant:

static VkRenderPass synthesize_render_pass(StateRecorder &recorder, spvc_compiler frag,
                                           uint32_t view_count, uint8_t &active_rt_mask)
{
	if (!frag)
		return VK_NULL_HANDLE;

	spvc_resources resources;
	if (spvc_compiler_create_shader_resources(frag, &resources) != SPVC_SUCCESS)
	{
		LOGE("Failed to reflect resources.\n");
		return VK_NULL_HANDLE;
	}

	const spvc_reflected_resource *list;
	size_t count;

	VkFormat rt_formats[8] = {};
	VkFormat input_rt_formats[8] = {};
	unsigned num_rts = 0;
	unsigned num_input_rts = 0;

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_STAGE_OUTPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationLocation);
		if (location + rt_count >= 8)
		{
			LOGE("RT index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
		{
			rt_formats[location + j] = base_format;
			active_rt_mask |= 1u << (location + j);
		}
	}

	if (spvc_resources_get_resource_list_for_type(resources, SPVC_RESOURCE_TYPE_SUBPASS_INPUT, &list, &count) != SPVC_SUCCESS)
		return VK_NULL_HANDLE;

	for (size_t i = 0; i < count; i++)
	{
		unsigned rt_count = 1;
		spvc_type rt_type = spvc_compiler_get_type_handle(frag, list[i].type_id);

		if (spvc_type_get_num_array_dimensions(rt_type) == 1)
		{
			if (!spvc_type_array_dimension_is_literal(rt_type, 0))
				return VK_NULL_HANDLE;
			rt_count = spvc_type_get_array_dimension(rt_type, 0);
		}

		uint32_t location = spvc_compiler_get_decoration(frag, list[i].id, SpvDecorationInputAttachmentIndex);
		if (location + rt_count >= 8)
		{
			LOGE("Input attachment index %u (array size %u) is out of range.\n", location, rt_count);
			return VK_NULL_HANDLE;
		}

		VkFormat base_format = VK_FORMAT_UNDEFINED;
		switch (spvc_type_get_basetype(rt_type))
		{
		case SPVC_BASETYPE_FP16:
		case SPVC_BASETYPE_FP32:
			base_format = VK_FORMAT_R8G8B8A8_UNORM;
			break;

		case SPVC_BASETYPE_INT16:
		case SPVC_BASETYPE_INT32:
			base_format = VK_FORMAT_R8G8B8A8_SINT;
			break;

		case SPVC_BASETYPE_UINT16:
		case SPVC_BASETYPE_UINT32:
			base_format = VK_FORMAT_R8G8B8A8_UINT;
			break;

		default:
			break;
		}

		for (unsigned j = 0; j < rt_count; j++)
			input_rt_formats[location + j] = base_format;
	}

	for (unsigned i = 0; i < 8; i++)
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_rts = i + 1;

	for (unsigned i = 0; i < 8; i++)
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
			num_input_rts = i + 1;

	if (num_rts + num_input_rts > 8)
	{
		LOGE("Number of total attachments exceeds 8.\n");
		return VK_NULL_HANDLE;
	}

	unsigned output_location_to_attachment[8] = {};
	unsigned input_location_to_attachment[8] = {};

	VkRenderPassCreateInfo2 info = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 };
	VkAttachmentDescription2 attachments[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			output_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			auto &att = attachments[info.attachmentCount];
			att.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
			att.format = input_rt_formats[i];
			att.samples = VK_SAMPLE_COUNT_1_BIT;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.initialLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			att.finalLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
			input_location_to_attachment[i] = info.attachmentCount;
			info.attachmentCount++;
		}
	}

	VkSubpassDescription2 subpass = { VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2 };
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	// view_count of 0 translates to default 0 mask.
	subpass.viewMask = (1u << view_count) - 1u;

	VkAttachmentReference2 references[8] = {};
	VkAttachmentReference2 input_references[8] = {};

	for (unsigned i = 0; i < num_rts; i++)
	{
		references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			references[i].attachment = output_location_to_attachment[i];
			references[i].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		}
		else
		{
			references[i].attachment = VK_ATTACHMENT_UNUSED;
			references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	for (unsigned i = 0; i < num_input_rts; i++)
	{
		input_references[i].sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		if (input_rt_formats[i] != VK_FORMAT_UNDEFINED)
		{
			input_references[i].attachment = input_location_to_attachment[i];
			input_references[i].layout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
		}
		else
		{
			input_references[i].attachment = VK_ATTACHMENT_UNUSED;
			input_references[i].layout = VK_IMAGE_LAYOUT_UNDEFINED;
		}
	}

	subpass.colorAttachmentCount = num_rts;
	subpass.pColorAttachments = references;
	subpass.inputAttachmentCount = num_input_rts;
	subpass.pInputAttachments = input_references;

	info.subpassCount = 1;
	info.pSubpasses = &subpass;
	info.pAttachments = attachments;

	if (!recorder.record_render_pass2((VkRenderPass)uint64_t(1), info))
		return VK_NULL_HANDLE;

	return (VkRenderPass)uint64_t(1);
}